

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_table_function.cpp
# Opt level: O1

bool __thiscall
duckdb::Binder::BindTableFunctionParameters
          (Binder *this,TableFunctionCatalogEntry *table_function,
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
          *expressions,vector<duckdb::LogicalType,_true> *arguments,
          vector<duckdb::Value,_true> *parameters,named_parameter_map_t *named_parameters,
          unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>,_true>
          *subquery,ErrorData *error)

{
  pointer puVar1;
  LogicalType *pLVar2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var3;
  long *plVar4;
  ClientContext *pCVar5;
  pointer pcVar6;
  _Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false> _Var7;
  undefined1 auVar8 [8];
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  bool bVar13;
  int iVar14;
  pointer pPVar15;
  reference pvVar16;
  long lVar17;
  pointer pBVar18;
  pointer pBVar19;
  BaseExpression *pBVar20;
  ComparisonExpression *pCVar21;
  ColumnRefExpression *this_00;
  pointer pEVar22;
  type expr_00;
  mapped_type *this_01;
  Binder *pBVar23;
  SubqueryExpression *pSVar24;
  pointer pSVar25;
  _Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false> _Var26;
  type other;
  undefined8 extraout_RAX;
  undefined8 uVar27;
  undefined8 extraout_RAX_00;
  InternalException *pIVar28;
  ParameterNotResolvedException *this_02;
  BinderException *this_03;
  byte bVar29;
  byte bVar30;
  pointer pLVar31;
  byte bVar32;
  optional_ptr<duckdb::LogicalType,_true> result_type;
  size_type __n;
  bool bVar33;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *expr;
  pointer this_04;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> expr_1;
  string parameter_name;
  Value constant;
  LogicalType sql_type;
  TableFunctionBinder binder;
  bool local_3d0;
  undefined1 local_3b0 [8];
  undefined1 local_3a8 [32];
  optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true> local_388;
  __node_base local_380;
  Binder *local_378;
  ClientContext *local_370;
  optional_ptr<duckdb::ExpressionBinder,_true> local_368;
  pointer local_360;
  undefined1 local_358 [32];
  undefined1 local_338 [8];
  _Alloc_hider local_330;
  char local_328 [8];
  char local_320 [16];
  string local_310 [16];
  _Hash_node_base local_300 [2];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_2f0 [56];
  undefined1 local_2b8 [112];
  _Hash_node_base local_248 [2];
  LogicalType local_238;
  LogicalType local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e8 [72];
  optional_ptr<duckdb::ExpressionBinder,_true> local_1a0;
  ExpressionBinder *local_198;
  _Alloc_hider local_180;
  LogicalType local_170 [12];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  
  this_04 = (expressions->
            super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (expressions->
           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_370 = (ClientContext *)parameters;
  local_360 = (pointer)named_parameters;
  if (this_04 == puVar1) {
    bVar30 = 0;
  }
  else {
    bVar13 = true;
    do {
      pPVar15 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(this_04);
      iVar14 = (*(pPVar15->super_BaseExpression)._vptr_BaseExpression[5])(pPVar15);
      if ((char)iVar14 == '\0') {
        bVar13 = false;
        break;
      }
      this_04 = this_04 + 1;
    } while (this_04 != puVar1);
    if (bVar13) {
      bVar30 = 0;
    }
    else {
      if ((table_function->functions).super_FunctionSet<duckdb::TableFunction>.functions.
          super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
          super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          (table_function->functions).super_FunctionSet<duckdb::TableFunction>.functions.
          super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
          super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>._M_impl.
          super__Vector_impl_data._M_start) {
        bVar30 = 0;
        bVar32 = 0;
        bVar33 = false;
        bVar13 = false;
      }
      else {
        __n = 0;
        bVar33 = false;
        bVar32 = 0;
        bVar29 = 0;
        do {
          pvVar16 = vector<duckdb::TableFunction,_true>::operator[]
                              (&(table_function->functions).super_FunctionSet<duckdb::TableFunction>
                                .functions,__n);
          for (pLVar31 = (pvVar16->super_SimpleNamedParameterFunction).super_SimpleFunction.
                         arguments.
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pLVar31 !=
              (pvVar16->super_SimpleNamedParameterFunction).super_SimpleFunction.arguments.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish; pLVar31 = pLVar31 + 1) {
            if (pLVar31->id_ == TABLE) {
              bVar33 = true;
            }
          }
          bVar30 = 1;
          if (pvVar16->in_out_function == (table_in_out_function_t)0x0) {
            bVar30 = bVar29;
            if ((pvVar16->function == (table_function_t)0x0) &&
               (bVar32 = 1, pvVar16->bind_replace == (table_function_bind_replace_t)0x0)) {
              if (pvVar16->bind_operator == (table_function_bind_operator_t)0x0) {
                pIVar28 = (InternalException *)__cxa_allocate_exception(0x10);
                local_1e8._0_8_ = local_1e8 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1e8,
                           "Function \"%s\" has neither in_out_function nor function defined","");
                local_338 = (undefined1  [8])local_328;
                pcVar6 = (table_function->super_FunctionEntry).super_StandardEntry.
                         super_InCatalogEntry.super_CatalogEntry.name._M_dataplus._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)local_338,pcVar6,
                           pcVar6 + (table_function->super_FunctionEntry).super_StandardEntry.
                                    super_InCatalogEntry.super_CatalogEntry.name._M_string_length);
                InternalException::InternalException<std::__cxx11::string>
                          (pIVar28,(string *)local_1e8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_338);
                __cxa_throw(pIVar28,&InternalException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
            }
            else {
              bVar32 = 1;
            }
          }
          __n = __n + 1;
          lVar17 = (long)(table_function->functions).super_FunctionSet<duckdb::TableFunction>.
                         functions.
                         super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>
                         .
                         super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(table_function->functions).super_FunctionSet<duckdb::TableFunction>.
                         functions.
                         super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>
                         .
                         super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          bVar29 = bVar30;
        } while (__n < (ulong)((lVar17 >> 3) * 0x6fb586fb586fb587));
        bVar13 = lVar17 == 0x1b8;
      }
      if (bVar33) {
        bVar30 = 2;
        if (!bVar13) {
          pIVar28 = (InternalException *)__cxa_allocate_exception(0x10);
          local_1e8._0_8_ = local_1e8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1e8,
                     "Function \"%s\" has a TABLE parameter, and multiple function overloads - this is not supported"
                     ,"");
          local_338 = (undefined1  [8])local_328;
          pcVar6 = (table_function->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
                   super_CatalogEntry.name._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_338,pcVar6,
                     pcVar6 + (table_function->super_FunctionEntry).super_StandardEntry.
                              super_InCatalogEntry.super_CatalogEntry.name._M_string_length);
          InternalException::InternalException<std::__cxx11::string>
                    (pIVar28,(string *)local_1e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338)
          ;
          __cxa_throw(pIVar28,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      else if ((bVar32 & bVar30) != 0) {
        pIVar28 = (InternalException *)__cxa_allocate_exception(0x10);
        local_1e8._0_8_ = local_1e8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,
                   "Function \"%s\" is both an in_out_function and a table function","");
        local_338 = (undefined1  [8])local_328;
        pcVar6 = (table_function->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
                 super_CatalogEntry.name._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_338,pcVar6,
                   pcVar6 + (table_function->super_FunctionEntry).super_StandardEntry.
                            super_InCatalogEntry.super_CatalogEntry.name._M_string_length);
        InternalException::InternalException<std::__cxx11::string>
                  (pIVar28,(string *)local_1e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338);
        __cxa_throw(pIVar28,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  if (bVar30 == 1) {
    BindTableInTableOutFunction(this,expressions,subquery);
    pBVar18 = unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>,_true>
              ::operator->(subquery);
    pBVar19 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              ::operator->(&pBVar18->subquery);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              (&arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &(pBVar19->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    local_3d0 = true;
  }
  else {
    result_type.ptr =
         (LogicalType *)
         (expressions->
         super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         ).
         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    pLVar2 = (LogicalType *)
             (expressions->
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_3d0 = result_type.ptr == pLVar2;
    if (!local_3d0) {
      local_378 = (Binder *)&error->raw_message;
      local_380._M_nxt = (_Hash_node_base *)&error->final_message;
      local_388.ptr = (vector<duckdb::DummyBinding,_true> *)&error->extra_info;
      local_2b8._72_8_ = &PTR__TableFunction_02477bc0;
      local_2b8._64_8_ = &PTR__BoundSubqueryRef_02479530;
      local_2b8._88_8_ = &PTR__TableFunctionBinder_02479d20;
      local_2b8._80_8_ = &table_function->functions;
      local_368.ptr = (ExpressionBinder *)0x0;
      do {
        local_358._0_8_ = local_358 + 0x10;
        local_358._8_8_ = (pointer)0x0;
        local_358[0x10] = '\0';
        pPVar15 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                *)result_type.ptr);
        if ((pPVar15->super_BaseExpression).type == COMPARE_BOUNDARY_START) {
          pBVar20 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                   *)result_type.ptr)->super_BaseExpression;
          pCVar21 = BaseExpression::Cast<duckdb::ComparisonExpression>(pBVar20);
          pPVar15 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->(&pCVar21->left);
          if ((pPVar15->super_BaseExpression).type == COLUMN_REF) {
            pBVar20 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       ::operator->(&pCVar21->left)->super_BaseExpression;
            this_00 = BaseExpression::Cast<duckdb::ColumnRefExpression>(pBVar20);
            bVar13 = ColumnRefExpression::IsQualified(this_00);
            if (!bVar13) {
              ColumnRefExpression::GetColumnName_abi_cxx11_(this_00);
              ::std::__cxx11::string::_M_assign((string *)local_358);
              _Var3._M_head_impl =
                   (pCVar21->right).
                   super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   ._M_t.
                   super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
                   .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
              (pCVar21->right).
              super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
              .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
                   (ParsedExpression *)0x0;
              plVar4 = *(long **)result_type.ptr;
              *(ParsedExpression **)result_type.ptr = _Var3._M_head_impl;
              if (plVar4 != (long *)0x0) {
                (**(code **)(*plVar4 + 8))();
              }
            }
          }
        }
        else {
          pPVar15 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                  *)result_type.ptr);
          if ((pPVar15->super_BaseExpression).alias._M_string_length != 0) {
            unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                          *)result_type.ptr);
            ::std::__cxx11::string::_M_assign((string *)local_358);
          }
        }
        if ((bVar30 == 2) &&
           (pPVar15 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                    *)result_type.ptr),
           (pPVar15->super_BaseExpression).type == SUBQUERY)) {
          FunctionSet<duckdb::TableFunction>::GetFunctionByOffset
                    ((TableFunction *)local_1e8,
                     (FunctionSet<duckdb::TableFunction> *)local_2b8._80_8_,0);
          if (((long)(table_function->functions).super_FunctionSet<duckdb::TableFunction>.functions.
                     super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
                     super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(table_function->functions).super_FunctionSet<duckdb::TableFunction>.functions.
                     super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>.
                     super__Vector_base<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>
                     ._M_impl.super__Vector_impl_data._M_start != 0x1b8) ||
             (local_1a0.ptr == local_198)) {
            this_03 = (BinderException *)__cxa_allocate_exception(0x10);
            local_338 = (undefined1  [8])local_328;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_338,
                       "Only table-in-out functions can have subquery parameters - %s only accepts constant parameters"
                       ,"");
            local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_208,local_1e8._8_8_,
                       (pointer)((long)(_Hash_node_base **)local_1e8._8_8_ + local_1e8._16_8_));
            BinderException::BinderException<std::__cxx11::string>
                      (this_03,(string *)local_338,&local_208);
            __cxa_throw(this_03,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (((ulong)local_368.ptr & 1) == 0) {
            CreateBinder((Binder *)local_2b8,this->context,(optional_ptr<duckdb::Binder,_true>)this,
                         REGULAR_BINDER);
            pBVar23 = shared_ptr<duckdb::Binder,_true>::operator->
                                ((shared_ptr<duckdb::Binder,_true> *)local_2b8);
            pBVar23->can_contain_nulls = true;
            pBVar20 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                     *)result_type.ptr)->super_BaseExpression;
            pSVar24 = BaseExpression::Cast<duckdb::SubqueryExpression>(pBVar20);
            pBVar23 = shared_ptr<duckdb::Binder,_true>::operator->
                                ((shared_ptr<duckdb::Binder,_true> *)local_2b8);
            pSVar25 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                      ::operator->(&pSVar24->subquery);
            unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator*
                      (&pSVar25->node);
            BindNode((Binder *)local_3a8,(QueryNode *)pBVar23);
            _Var26._M_head_impl = (BoundSubqueryRef *)operator_new(0x30);
            uVar27 = local_3a8._0_8_;
            uVar9 = local_2b8._0_4_;
            uVar10 = local_2b8._4_4_;
            uVar11 = local_2b8._8_4_;
            uVar12 = local_2b8._12_4_;
            local_2b8._0_8_ = (_Hash_node_base *)0x0;
            local_2b8._8_8_ = (element_type *)0x0;
            local_3a8._0_8_ = (BoundQueryNode *)0x0;
            ((_Var26._M_head_impl)->super_BoundTableRef).type = SUBQUERY;
            ((_Var26._M_head_impl)->super_BoundTableRef).sample.
            super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> =
                 (unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)0x0
            ;
            ((_Var26._M_head_impl)->super_BoundTableRef)._vptr_BoundTableRef = local_2b8._64_8_;
            *(undefined4 *)&((_Var26._M_head_impl)->binder).internal = uVar9;
            *(undefined4 *)
             ((long)&((_Var26._M_head_impl)->binder).internal.
                     super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) =
                 uVar10;
            *(undefined4 *)
             &((_Var26._M_head_impl)->binder).internal.
              super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 uVar11;
            *(undefined4 *)
             ((long)&((_Var26._M_head_impl)->binder).internal.
                     super___shared_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 4) = uVar12;
            ((_Var26._M_head_impl)->subquery).
            super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_> =
                 (unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>)
                 uVar27;
            _Var7._M_head_impl =
                 (subquery->
                 super_unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::BoundSubqueryRef_*,_std::default_delete<duckdb::BoundSubqueryRef>_>
                 .super__Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false>._M_head_impl;
            (subquery->
            super_unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::BoundSubqueryRef_*,_std::default_delete<duckdb::BoundSubqueryRef>_>
            .super__Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false>._M_head_impl =
                 _Var26._M_head_impl;
            if (_Var7._M_head_impl != (BoundSubqueryRef *)0x0) {
              (**(code **)(*(long *)&(_Var7._M_head_impl)->super_BoundTableRef + 8))();
            }
            pBVar18 = unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>,_true>
                      ::operator->(subquery);
            other = shared_ptr<duckdb::Binder,_true>::operator*(&pBVar18->binder);
            MoveCorrelatedExpressions(this,other);
            local_338[0] = 0x67;
            ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
            emplace_back<duckdb::LogicalTypeId>
                      (&arguments->
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                       local_338);
            LogicalType::LogicalType(&local_220,SQLNULL);
            Value::Value((Value *)local_338,&local_220);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
            emplace_back<duckdb::Value>
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_370,
                       (Value *)local_338);
            Value::~Value((Value *)local_338);
            LogicalType::~LogicalType(&local_220);
            uVar27 = extraout_RAX;
            if ((BoundQueryNode *)local_3a8._0_8_ != (BoundQueryNode *)0x0) {
              uVar27 = (**(code **)(*(long *)local_3a8._0_8_ + 8))();
            }
            if ((element_type *)local_2b8._8_8_ != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_);
              uVar27 = extraout_RAX_00;
            }
            iVar14 = 3;
            local_368.ptr = (ExpressionBinder *)CONCAT71((int7)((ulong)uVar27 >> 8),1);
          }
          else {
            local_2b8._0_8_ = local_2b8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2b8,"Table function can have at most one subquery parameter",
                       "");
            ErrorData::ErrorData((ErrorData *)local_338,(string *)local_2b8);
            auVar8 = local_338;
            error->initialized = (bool)local_338[0];
            error->type = local_338[1];
            local_338 = auVar8;
            ::std::__cxx11::string::operator=((string *)local_378,(string *)(local_338 + 8));
            ::std::__cxx11::string::operator=((string *)local_380._M_nxt,local_310);
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)local_388.ptr,local_2f0);
            ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable(local_2f0);
            if ((_Hash_node_base *)local_310._0_8_ != local_300) {
              operator_delete((void *)local_310._0_8_);
            }
            if (local_330._M_p != local_320) {
              operator_delete(local_330._M_p);
            }
            if ((_Hash_node_base *)local_2b8._0_8_ != (_Hash_node_base *)(local_2b8 + 0x10)) {
              operator_delete((void *)local_2b8._0_8_);
            }
            iVar14 = 1;
          }
          local_1e8._0_8_ = local_2b8._72_8_;
          if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
          }
          SimpleNamedParameterFunction::~SimpleNamedParameterFunction
                    ((SimpleNamedParameterFunction *)local_1e8);
        }
        else {
          pCVar5 = this->context;
          local_2b8._96_8_ = local_248;
          pcVar6 = (table_function->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
                   super_CatalogEntry.name._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)(local_2b8 + 0x60),pcVar6,
                     pcVar6 + (table_function->super_FunctionEntry).super_StandardEntry.
                              super_InCatalogEntry.super_CatalogEntry.name._M_string_length);
          TableFunctionBinder::TableFunctionBinder
                    ((TableFunctionBinder *)local_1e8,this,pCVar5,(string *)(local_2b8 + 0x60));
          if ((_Hash_node_base *)local_2b8._96_8_ != local_248) {
            operator_delete((void *)local_2b8._96_8_);
          }
          LogicalType::LogicalType(&local_238);
          ExpressionBinder::Bind
                    ((ExpressionBinder *)local_3b0,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)local_1e8,result_type,SUB81(&local_238,0));
          pEVar22 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)local_3b0);
          iVar14 = (*(pEVar22->super_BaseExpression)._vptr_BaseExpression[6])(pEVar22);
          if ((char)iVar14 != '\0') {
            this_02 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
            ParameterNotResolvedException::ParameterNotResolvedException(this_02);
            __cxa_throw(this_02,&ParameterNotResolvedException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          pEVar22 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)local_3b0);
          iVar14 = (*(pEVar22->super_BaseExpression)._vptr_BaseExpression[5])(pEVar22);
          if ((char)iVar14 == '\0') {
            pIVar28 = (InternalException *)__cxa_allocate_exception(0x10);
            local_338 = (undefined1  [8])local_328;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_338,"Table function requires a constant parameter","");
            InternalException::InternalException(pIVar28,(string *)local_338);
            __cxa_throw(pIVar28,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pCVar5 = this->context;
          expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)local_3b0);
          ExpressionExecutor::EvaluateScalar((Value *)local_2b8,pCVar5,expr_00,true);
          if ((pointer)local_358._8_8_ == (pointer)0x0) {
            if (*(long *)((long)&(local_360->name).field_2 + 8) == 0) {
              if (local_2b8[0x18] == '\x01') {
                LogicalType::LogicalType((LogicalType *)local_338,SQLNULL);
              }
              else {
                LogicalType::LogicalType((LogicalType *)local_338,&local_238);
              }
              ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
              emplace_back<duckdb::LogicalType>
                        (&arguments->
                          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
                         (LogicalType *)local_338);
              LogicalType::~LogicalType((LogicalType *)local_338);
              iVar14 = 0;
              ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
              emplace_back<duckdb::Value>
                        ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_370,
                         (Value *)local_2b8);
            }
            else {
              local_3a8._0_8_ = local_3a8 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3a8,"Unnamed parameters cannot come after named parameters"
                         ,"");
              ErrorData::ErrorData((ErrorData *)local_338,(string *)local_3a8);
              auVar8 = local_338;
              error->initialized = (bool)local_338[0];
              error->type = local_338[1];
              local_338 = auVar8;
              ::std::__cxx11::string::operator=((string *)local_378,(string *)(local_338 + 8));
              ::std::__cxx11::string::operator=((string *)local_380._M_nxt,local_310);
              ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                *)local_388.ptr,local_2f0);
              ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::~_Hashtable(local_2f0);
              if ((_Hash_node_base *)local_310._0_8_ != local_300) {
                operator_delete((void *)local_310._0_8_);
              }
              if (local_330._M_p != local_320) {
                operator_delete(local_330._M_p);
              }
              if ((BoundQueryNode *)local_3a8._0_8_ != (BoundQueryNode *)(local_3a8 + 0x10)) {
                operator_delete((void *)local_3a8._0_8_);
              }
              iVar14 = 1;
            }
          }
          else {
            this_01 = ::std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_360,(key_type *)local_358);
            Value::operator=(this_01,(Value *)local_2b8);
            iVar14 = 0;
          }
          Value::~Value((Value *)local_2b8);
          if (local_3b0 != (undefined1  [8])0x0) {
            (**(code **)(*(_func_int **)local_3b0 + 8))();
          }
          LogicalType::~LogicalType(&local_238);
          local_1e8._0_8_ = local_2b8._88_8_;
          if ((LogicalType *)local_180._M_p != local_170) {
            operator_delete(local_180._M_p);
          }
          ExpressionBinder::~ExpressionBinder((ExpressionBinder *)local_1e8);
        }
        if ((pointer)local_358._0_8_ != (pointer)(local_358 + 0x10)) {
          operator_delete((void *)local_358._0_8_);
        }
        if ((iVar14 != 3) && (iVar14 != 0)) {
          return local_3d0;
        }
        result_type.ptr = (LogicalType *)&(result_type.ptr)->type_info_;
        local_3d0 = result_type.ptr == pLVar2;
      } while (!local_3d0);
    }
  }
  return local_3d0;
}

Assistant:

bool Binder::BindTableFunctionParameters(TableFunctionCatalogEntry &table_function,
                                         vector<unique_ptr<ParsedExpression>> &expressions,
                                         vector<LogicalType> &arguments, vector<Value> &parameters,
                                         named_parameter_map_t &named_parameters,
                                         unique_ptr<BoundSubqueryRef> &subquery, ErrorData &error) {
	auto bind_type = GetTableFunctionBindType(table_function, expressions);
	if (bind_type == TableFunctionBindType::TABLE_IN_OUT_FUNCTION) {
		// bind table in-out function
		BindTableInTableOutFunction(expressions, subquery);
		// fetch the arguments from the subquery
		arguments = subquery->subquery->types;
		return true;
	}
	bool seen_subquery = false;
	for (auto &child : expressions) {
		string parameter_name;

		// hack to make named parameters work
		if (child->GetExpressionType() == ExpressionType::COMPARE_EQUAL) {
			// comparison, check if the LHS is a columnref
			auto &comp = child->Cast<ComparisonExpression>();
			if (comp.left->GetExpressionType() == ExpressionType::COLUMN_REF) {
				auto &colref = comp.left->Cast<ColumnRefExpression>();
				if (!colref.IsQualified()) {
					parameter_name = colref.GetColumnName();
					child = std::move(comp.right);
				}
			}
		} else if (!child->GetAlias().empty()) {
			// <name> => <expression> will set the alias of <expression> to <name>
			parameter_name = child->GetAlias();
		}
		if (bind_type == TableFunctionBindType::TABLE_PARAMETER_FUNCTION &&
		    child->GetExpressionType() == ExpressionType::SUBQUERY) {
			D_ASSERT(table_function.functions.Size() == 1);
			auto fun = table_function.functions.GetFunctionByOffset(0);
			if (table_function.functions.Size() != 1 || fun.arguments.empty()) {
				throw BinderException(
				    "Only table-in-out functions can have subquery parameters - %s only accepts constant parameters",
				    fun.name);
			}
			if (seen_subquery) {
				error = ErrorData("Table function can have at most one subquery parameter");
				return false;
			}
			auto binder = Binder::CreateBinder(this->context, this);
			binder->can_contain_nulls = true;
			auto &se = child->Cast<SubqueryExpression>();
			auto node = binder->BindNode(*se.subquery->node);
			subquery = make_uniq<BoundSubqueryRef>(std::move(binder), std::move(node));
			MoveCorrelatedExpressions(*subquery->binder);
			seen_subquery = true;
			arguments.emplace_back(LogicalTypeId::TABLE);
			parameters.emplace_back(Value());
			continue;
		}

		TableFunctionBinder binder(*this, context, table_function.name);
		LogicalType sql_type;
		auto expr = binder.Bind(child, &sql_type);
		if (expr->HasParameter()) {
			throw ParameterNotResolvedException();
		}
		if (!expr->IsScalar()) {
			// should have been eliminated before
			throw InternalException("Table function requires a constant parameter");
		}
		auto constant = ExpressionExecutor::EvaluateScalar(context, *expr, true);
		if (parameter_name.empty()) {
			// unnamed parameter
			if (!named_parameters.empty()) {
				error = ErrorData("Unnamed parameters cannot come after named parameters");
				return false;
			}
			arguments.emplace_back(constant.IsNull() ? LogicalType::SQLNULL : sql_type);
			parameters.emplace_back(std::move(constant));
		} else {
			named_parameters[parameter_name] = std::move(constant);
		}
	}
	return true;
}